

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

Status kwssys::SystemTools::SetPermissions(char *file,mode_t mode,bool honor_umask)

{
  byte in_DL;
  char *in_RDI;
  undefined8 in_stack_ffffffffffffff98;
  string *file_00;
  undefined1 local_39 [36];
  byte local_15;
  Status local_8;
  
  local_15 = in_DL & 1;
  if (in_RDI == (char *)0x0) {
    local_8 = Status::POSIX((int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
  }
  else {
    file_00 = (string *)local_39;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_39 + 1),in_RDI,(allocator *)file_00);
    local_8 = SetPermissions(file_00,(mode_t)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0))
    ;
    std::__cxx11::string::~string((string *)(local_39 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_39);
  }
  return local_8;
}

Assistant:

Status SystemTools::SetPermissions(const char* file, mode_t mode,
                                   bool honor_umask)
{
  if (!file) {
    return Status::POSIX(EINVAL);
  }
  return SystemTools::SetPermissions(std::string(file), mode, honor_umask);
}